

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1eec638::SatdTestBase<short,_int_(*)(const_short_*,_int)>::SetUp
          (SatdTestBase<short,_int_(*)(const_short_*,_int)> *this)

{
  short *psVar1;
  SEARCH_METHODS *message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  undefined8 *local_18;
  
  (this->rnd_).random_.state_ = 0xbaba;
  psVar1 = (short *)aom_memalign(0x20,(long)this->satd_size_ * 2);
  this->src_ = psVar1;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<short*,decltype(nullptr)>
            (local_20,"src_","nullptr",&this->src_,&local_30._M_head_impl);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x37b,(char *)message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

void SetUp() override {
    rnd_.Reset(ACMRandom::DeterministicSeed());
    src_ = reinterpret_cast<CoeffType *>(
        aom_memalign(32, sizeof(*src_) * satd_size_));
    ASSERT_NE(src_, nullptr);
  }